

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O3

void vera::setWindowSize(int _width,int _height)

{
  GLFWwindow *handle;
  float fVar1;
  float fVar2;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined1 auVar3 [16];
  undefined1 auVar5 [16];
  undefined4 local_28;
  undefined4 uStack_24;
  undefined1 auVar4 [16];
  
  handle = window;
  if (properties.style != EMBEDDED) {
    fVar1 = getPixelDensity(true);
    fVar2 = getPixelDensity(true);
    glfwSetWindowSize(handle,(int)((float)_width / fVar1),(int)((float)_height / fVar2));
  }
  uStack_24 = (float)_height;
  local_28 = (float)_width;
  fVar1 = getPixelDensity(true);
  fVar2 = getPixelDensity(true);
  auVar5._4_4_ = extraout_XMM0_Db;
  auVar5._0_4_ = fVar1;
  auVar5._8_4_ = extraout_XMM0_Db;
  auVar5._12_4_ = extraout_XMM0_Db_00;
  auVar4._8_8_ = auVar5._8_8_;
  auVar4._4_4_ = fVar2;
  auVar4._0_4_ = fVar1;
  auVar3._4_4_ = uStack_24;
  auVar3._0_4_ = local_28;
  auVar3._8_8_ = 0;
  auVar3 = divps(auVar3,auVar4);
  viewport.field_2.z = (int)auVar3._0_4_;
  viewport.field_3.w = (int)auVar3._4_4_;
  updateViewport();
  return;
}

Assistant:

void setWindowSize(int _width, int _height) {
#if defined(__EMSCRIPTEN__)
    setViewport((float)_width, (float)_height);
    glfwSetWindowSize(window, _width * getPixelDensity(true), _height * getPixelDensity(true));
    return;

#elif defined(DRIVER_GLFW)
    if (properties.style != EMBEDDED)
        glfwSetWindowSize(window, _width / getPixelDensity(true), _height / getPixelDensity(true));
#endif

    setViewport((float)_width / getPixelDensity(true), (float)_height / getPixelDensity(true));
}